

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile.cpp
# Opt level: O0

int __thiscall ncnn::Tile::forward(Tile *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  long *in_RDX;
  long *in_RSI;
  long in_RDI;
  bool bVar2;
  float *outptr_3;
  float *ptr_3;
  int p_3;
  int p_2;
  int size_1;
  float *outptr_2;
  float *ptr_2;
  int p_1;
  int size;
  float *outptr_1;
  float *ptr_1;
  int z_1;
  int p;
  float *outptr;
  float *ptr;
  int y;
  int z;
  int q;
  int outdims;
  size_t elemsize;
  int channels;
  int d;
  int h;
  int w;
  int *repeats_ptr;
  int repeats_num;
  int repeat_c;
  int repeat_d;
  int repeat_h;
  int repeat_w;
  int dims;
  Mat *m;
  Mat *m_5;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m_7;
  Mat *m_6;
  Allocator *in_stack_fffffffffffff018;
  Allocator *in_stack_fffffffffffff020;
  int _h;
  size_t in_stack_fffffffffffff028;
  int _w;
  Mat *in_stack_fffffffffffff030;
  undefined8 in_stack_fffffffffffff038;
  Mat *in_stack_fffffffffffff040;
  Allocator *in_stack_fffffffffffff090;
  undefined8 local_df8;
  undefined8 local_df0;
  undefined8 local_de8;
  undefined4 local_de0;
  long local_dd8;
  undefined4 local_dd0;
  undefined4 local_dcc;
  undefined4 local_dc8;
  undefined4 local_dc4;
  undefined4 local_dc0;
  undefined8 local_db8;
  void *local_db0;
  undefined8 local_da8;
  undefined8 local_da0;
  undefined8 local_d98;
  undefined4 local_d90;
  long local_d88;
  undefined4 local_d80;
  undefined4 local_d7c;
  undefined4 local_d78;
  undefined4 local_d74;
  undefined4 local_d70;
  undefined8 local_d68;
  void *local_d60;
  int local_d54;
  int local_d50;
  int local_d4c;
  undefined8 local_d48;
  undefined8 local_d40;
  undefined8 local_d38;
  undefined4 local_d30;
  long local_d28;
  undefined4 local_d20;
  undefined4 local_d1c;
  undefined4 local_d18;
  undefined4 local_d14;
  undefined4 local_d10;
  undefined8 local_d08;
  undefined8 local_d00;
  undefined8 local_cf8;
  undefined8 local_cf0;
  undefined4 local_ce8;
  long local_ce0;
  undefined4 local_cd8;
  undefined4 local_cd4;
  undefined4 local_cd0;
  undefined4 local_ccc;
  undefined4 local_cc8;
  undefined8 local_cc0;
  void *local_cb8;
  undefined8 local_cb0;
  undefined8 local_ca8;
  undefined8 local_ca0;
  undefined4 local_c98;
  long local_c90;
  undefined4 local_c88;
  undefined4 local_c84;
  undefined4 local_c80;
  undefined4 local_c7c;
  undefined4 local_c78;
  undefined8 local_c70;
  void *local_c68;
  int local_c60;
  int local_c5c;
  undefined8 local_c58;
  undefined8 local_c50;
  undefined8 local_c48;
  undefined4 local_c40;
  long local_c38;
  undefined4 local_c30;
  undefined4 local_c2c;
  undefined4 local_c28;
  undefined4 local_c24;
  undefined4 local_c20;
  undefined8 local_c18;
  undefined8 local_c10;
  undefined8 local_c08;
  undefined8 local_c00;
  undefined4 local_bf8;
  long local_bf0;
  undefined4 local_be8;
  undefined4 local_be4;
  undefined4 local_be0;
  undefined4 local_bdc;
  undefined4 local_bd8;
  undefined8 local_bd0;
  void *local_bc8;
  undefined8 local_bc0;
  undefined8 local_bb8;
  undefined8 local_bb0;
  undefined4 local_ba8;
  long local_ba0;
  undefined4 local_b98;
  undefined4 local_b94;
  undefined4 local_b90;
  undefined4 local_b8c;
  undefined4 local_b88;
  undefined8 local_b80;
  undefined8 local_b78;
  undefined8 local_b70;
  undefined8 local_b68;
  undefined4 local_b60;
  long local_b58;
  undefined4 local_b50;
  undefined4 local_b4c;
  undefined4 local_b48;
  undefined4 local_b44;
  undefined4 local_b40;
  undefined8 local_b38;
  void *local_b30;
  int local_b28;
  int local_b24;
  undefined8 local_b20;
  undefined8 local_b18;
  undefined8 local_b10;
  undefined4 local_b08;
  long local_b00;
  undefined4 local_af8;
  undefined4 local_af4;
  undefined4 local_af0;
  undefined4 local_aec;
  undefined4 local_ae8;
  undefined8 local_ae0;
  undefined8 local_ad8;
  undefined8 local_ad0;
  undefined8 local_ac8;
  undefined4 local_ac0;
  long local_ab8;
  undefined4 local_ab0;
  undefined4 local_aac;
  undefined4 local_aa8;
  undefined4 local_aa4;
  undefined4 local_aa0;
  undefined8 local_a98;
  void *local_a90;
  undefined8 local_a78;
  undefined8 local_a70;
  undefined8 local_a68;
  undefined4 local_a60;
  long local_a58;
  undefined4 local_a50;
  undefined4 local_a4c;
  undefined4 local_a48;
  undefined4 local_a44;
  undefined4 local_a40;
  undefined8 local_a38;
  undefined8 local_a30;
  undefined8 local_a28;
  undefined8 local_a20;
  undefined4 local_a18;
  long local_a10;
  undefined4 local_a08;
  undefined4 local_a04;
  undefined4 local_a00;
  undefined4 local_9fc;
  undefined4 local_9f8;
  undefined8 local_9f0;
  void *local_9e8;
  int local_9e0;
  int local_9dc;
  int local_9d8;
  int local_9d4;
  long local_9d0;
  int local_9c8;
  int local_9c4;
  int local_9c0;
  int local_9bc;
  int *local_9b8;
  int local_9b0;
  int local_9ac;
  int local_9a8;
  int local_9a4;
  int local_9a0;
  int local_99c [3];
  long *local_990;
  long *local_988;
  int local_974;
  int local_970;
  undefined4 local_96c;
  long *local_968;
  long *local_960;
  undefined8 *local_950;
  undefined8 *local_940;
  undefined8 *local_930;
  undefined8 *local_920;
  undefined8 *local_910;
  undefined8 *local_900;
  undefined8 *local_8f0;
  undefined8 *local_8e0;
  undefined8 *local_8d0;
  undefined8 *local_8c0;
  undefined8 *local_8b0;
  undefined8 *local_8a0;
  undefined8 *local_890;
  long *local_880;
  long *local_878;
  undefined8 *local_870;
  undefined1 local_865;
  int local_864;
  undefined8 *local_858;
  int local_844;
  undefined8 *local_840;
  undefined8 *local_838;
  int local_82c;
  undefined8 *local_828;
  undefined1 local_81d;
  int local_81c;
  undefined8 *local_810;
  undefined1 local_7fd;
  int local_7fc;
  undefined8 *local_7f0;
  undefined1 local_7dd;
  int local_7dc;
  undefined8 *local_7d0;
  undefined1 local_7bd;
  int local_7bc;
  undefined8 *local_7b0;
  undefined1 local_79d;
  int local_79c;
  undefined8 *local_790;
  int local_77c;
  undefined8 *local_778;
  undefined8 *local_770;
  int local_764;
  undefined8 *local_760;
  undefined8 *local_758;
  int local_74c;
  undefined8 *local_748;
  undefined8 *local_740;
  int local_734;
  undefined8 *local_730;
  undefined8 *local_728;
  int local_71c;
  undefined8 *local_718;
  int local_70c;
  undefined8 *local_708;
  undefined8 *local_700;
  undefined8 *local_6f8;
  undefined8 *local_6f0;
  undefined8 *local_6e8;
  undefined8 *local_6e0;
  undefined1 local_6d1;
  int local_6d0;
  int local_6cc;
  undefined8 *local_6c0;
  undefined1 local_6a9;
  int local_6a8;
  undefined4 local_6a4;
  undefined8 *local_698;
  undefined8 *local_5f0;
  undefined8 *local_5d0;
  undefined8 *local_5b0;
  undefined8 *local_590;
  undefined8 *local_570;
  undefined8 *local_550;
  undefined8 *local_530;
  undefined8 *local_510;
  undefined8 *local_4f0;
  undefined8 *local_4d0;
  undefined8 *local_4b0;
  undefined8 *local_490;
  undefined8 *local_470;
  int local_468;
  undefined4 local_464;
  long *local_460;
  void *local_458;
  long *local_340;
  long *local_338;
  long local_330;
  undefined4 local_324;
  long local_320;
  long local_318;
  undefined4 local_30c;
  int local_308;
  int local_304;
  undefined8 *local_300;
  long local_2f8;
  undefined4 local_2ec;
  long local_2e8;
  long local_2e0;
  undefined4 local_2d4;
  int local_2d0;
  int local_2cc;
  undefined8 *local_2c8;
  long local_2c0;
  undefined4 local_2b4;
  long local_2b0;
  long local_2a8;
  undefined4 local_29c;
  int local_298;
  int local_294;
  undefined8 *local_290;
  long local_288;
  undefined4 local_27c;
  long local_278;
  void *local_270;
  undefined4 local_264;
  int local_260;
  int local_25c;
  undefined8 *local_258;
  long local_250;
  undefined4 local_244;
  long local_240;
  long local_238;
  undefined4 local_22c;
  int local_228;
  int local_224;
  undefined8 *local_220;
  long local_218;
  undefined4 local_20c;
  long local_208;
  long local_200;
  undefined4 local_1f4;
  int local_1f0;
  int local_1ec;
  undefined8 *local_1e8;
  undefined4 local_1dc;
  long local_1d8;
  undefined4 local_1cc;
  long local_1c8;
  undefined4 local_1bc;
  long local_1b8;
  undefined4 local_1ac;
  long local_1a8;
  undefined4 local_19c;
  long local_198;
  undefined4 local_18c;
  long local_188;
  long local_180;
  undefined4 local_174;
  long local_170;
  long local_168;
  int local_160;
  int local_15c;
  undefined8 *local_158;
  long local_150;
  undefined4 local_144;
  long local_140;
  void *local_138;
  int local_130;
  int local_12c;
  undefined8 *local_128;
  long local_120;
  undefined4 local_114;
  long local_110;
  long local_108;
  int local_100;
  int local_fc;
  undefined8 *local_f8;
  long local_f0;
  undefined4 local_e4;
  long local_e0;
  void *local_d8;
  int local_d0;
  int local_cc;
  undefined8 *local_c8;
  long local_c0;
  undefined4 local_b4;
  long local_b0;
  long local_a8;
  int local_a0;
  int local_9c;
  undefined8 *local_98;
  long local_90;
  undefined4 local_84;
  long local_80;
  void *local_78;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  undefined8 *local_60;
  undefined4 local_54;
  long local_50;
  long local_48;
  undefined4 local_3c;
  long local_38;
  void *local_30;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  undefined8 *local_18;
  undefined4 local_c;
  long local_8;
  
  local_99c[0] = (int)in_RSI[5];
  local_9a0 = 1;
  local_9a4 = 1;
  local_9a8 = 1;
  local_9ac = 1;
  local_9b0 = *(int *)(in_RDI + 0x104);
  local_878 = (long *)(in_RDI + 0xd8);
  bVar2 = true;
  if (*local_878 != 0) {
    bVar2 = *(long *)(in_RDI + 0x118) * (long)*(int *)(in_RDI + 0x110) == 0;
    local_340 = local_878;
  }
  if (bVar2) {
    if (local_99c[0] == 1) {
      local_9a0 = *(int *)(in_RDI + 0xd4);
    }
    else if (local_99c[0] == 2) {
      if (*(int *)(in_RDI + 0xd0) == 0) {
        local_9a4 = *(int *)(in_RDI + 0xd4);
      }
      if (*(int *)(in_RDI + 0xd0) == 1) {
        local_9a0 = *(int *)(in_RDI + 0xd4);
      }
    }
    else if (local_99c[0] == 3) {
      if (*(int *)(in_RDI + 0xd0) == 0) {
        local_9ac = *(int *)(in_RDI + 0xd4);
      }
      if (*(int *)(in_RDI + 0xd0) == 1) {
        local_9a4 = *(int *)(in_RDI + 0xd4);
      }
      if (*(int *)(in_RDI + 0xd0) == 2) {
        local_9a0 = *(int *)(in_RDI + 0xd4);
      }
    }
    else if (local_99c[0] == 4) {
      if (*(int *)(in_RDI + 0xd0) == 0) {
        local_9ac = *(int *)(in_RDI + 0xd4);
      }
      if (*(int *)(in_RDI + 0xd0) == 1) {
        local_9a8 = *(int *)(in_RDI + 0xd4);
      }
      if (*(int *)(in_RDI + 0xd0) == 2) {
        local_9a4 = *(int *)(in_RDI + 0xd4);
      }
      if (*(int *)(in_RDI + 0xd0) == 3) {
        local_9a0 = *(int *)(in_RDI + 0xd4);
      }
    }
  }
  else {
    local_870 = (undefined8 *)(in_RDI + 0xd8);
    local_9b8 = (int *)*local_870;
    if (local_9b0 == 1) {
      local_9a0 = *local_9b8;
    }
    if (local_9b0 == 2) {
      local_9a4 = *local_9b8;
      local_9a0 = local_9b8[1];
    }
    if (local_9b0 == 3) {
      if (local_99c[0] == 4) {
        local_9a8 = *local_9b8;
        local_9a4 = local_9b8[1];
        local_9a0 = local_9b8[2];
      }
      else {
        local_9ac = *local_9b8;
        local_9a4 = local_9b8[1];
        local_9a0 = local_9b8[2];
      }
    }
    if (local_9b0 == 4) {
      local_9ac = *local_9b8;
      local_9a8 = local_9b8[1];
      local_9a4 = local_9b8[2];
      local_9a0 = local_9b8[3];
    }
  }
  local_9bc = *(int *)((long)in_RSI + 0x2c);
  local_9c0 = (int)in_RSI[6];
  local_9c4 = *(int *)((long)in_RSI + 0x34);
  local_9c8 = (int)in_RSI[7];
  local_9d0 = in_RSI[2];
  local_990 = in_RDX;
  local_988 = in_RSI;
  piVar1 = std::max<int>(local_99c,&local_9b0);
  local_9d4 = *piVar1;
  _w = (int)(in_stack_fffffffffffff028 >> 0x20);
  if ((((local_9a0 == 1) || (local_9a4 != 1)) || (local_9a8 != 1)) || (local_9ac != 1)) {
    _h = (int)in_stack_fffffffffffff028;
    if (((local_9a4 == 1) || (local_9a8 != 1)) || (local_9ac != 1)) {
      if ((local_9a8 == 1) && (local_9ac != 1)) {
        if (local_9d4 == 3) {
          Mat::create(in_stack_fffffffffffff040,(int)((ulong)in_stack_fffffffffffff038 >> 0x20),
                      (int)in_stack_fffffffffffff038,(int)((ulong)in_stack_fffffffffffff030 >> 0x20)
                      ,in_stack_fffffffffffff028,in_stack_fffffffffffff020);
        }
        if (local_9d4 == 4) {
          Mat::create(in_stack_fffffffffffff030,(int)(in_stack_fffffffffffff028 >> 0x20),
                      (int)in_stack_fffffffffffff028,(int)((ulong)in_stack_fffffffffffff020 >> 0x20)
                      ,(int)in_stack_fffffffffffff020,(size_t)in_stack_fffffffffffff018,
                      in_stack_fffffffffffff090);
        }
      }
      else if ((local_9a8 == 1) || (local_9ac == 1)) {
        if ((local_9b0 == 0) || (local_99c[0] == local_9b0)) {
          local_960 = local_990;
          local_968 = local_988;
          if (local_990 != local_988) {
            if (local_988[1] != 0) {
              piVar1 = (int *)local_988[1];
              local_96c = 1;
              LOCK();
              local_970 = *piVar1;
              *piVar1 = *piVar1 + 1;
              UNLOCK();
            }
            local_460 = local_990;
            if (local_990[1] != 0) {
              piVar1 = (int *)local_990[1];
              local_464 = 0xffffffff;
              LOCK();
              local_468 = *piVar1;
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (local_468 == 1) {
                if (local_990[4] == 0) {
                  local_458 = (void *)*local_990;
                  if (local_458 != (void *)0x0) {
                    free(local_458);
                  }
                }
                else {
                  (**(code **)(*(long *)local_990[4] + 0x18))((long *)local_990[4],*local_990);
                }
              }
            }
            *local_990 = 0;
            local_990[2] = 0;
            *(undefined4 *)(local_990 + 3) = 0;
            *(undefined4 *)(local_990 + 5) = 0;
            *(undefined4 *)((long)local_990 + 0x2c) = 0;
            *(undefined4 *)(local_990 + 6) = 0;
            *(undefined4 *)((long)local_990 + 0x34) = 0;
            *(undefined4 *)(local_990 + 7) = 0;
            local_990[8] = 0;
            local_990[1] = 0;
            *local_990 = *local_968;
            local_990[1] = local_968[1];
            local_990[2] = local_968[2];
            *(int *)(local_990 + 3) = (int)local_968[3];
            local_990[4] = local_968[4];
            *(int *)(local_990 + 5) = (int)local_968[5];
            *(undefined4 *)((long)local_990 + 0x2c) = *(undefined4 *)((long)local_968 + 0x2c);
            *(int *)(local_990 + 6) = (int)local_968[6];
            *(undefined4 *)((long)local_990 + 0x34) = *(undefined4 *)((long)local_968 + 0x34);
            *(int *)(local_990 + 7) = (int)local_968[7];
            local_990[8] = local_968[8];
          }
          return 0;
        }
        if (local_9d4 == 2) {
          Mat::create(in_stack_fffffffffffff030,_w,_h,(size_t)in_stack_fffffffffffff020,
                      in_stack_fffffffffffff018);
        }
        if (local_9d4 == 3) {
          Mat::create(in_stack_fffffffffffff040,(int)((ulong)in_stack_fffffffffffff038 >> 0x20),
                      (int)in_stack_fffffffffffff038,(int)((ulong)in_stack_fffffffffffff030 >> 0x20)
                      ,in_stack_fffffffffffff028,in_stack_fffffffffffff020);
        }
        if (local_9d4 == 4) {
          Mat::create(in_stack_fffffffffffff030,(int)(in_stack_fffffffffffff028 >> 0x20),
                      (int)in_stack_fffffffffffff028,(int)((ulong)in_stack_fffffffffffff020 >> 0x20)
                      ,(int)in_stack_fffffffffffff020,(size_t)in_stack_fffffffffffff018,
                      in_stack_fffffffffffff090);
        }
      }
      else if (local_9d4 == 4) {
        Mat::create(in_stack_fffffffffffff030,_w,_h,(int)((ulong)in_stack_fffffffffffff020 >> 0x20),
                    (int)in_stack_fffffffffffff020,(size_t)in_stack_fffffffffffff018,
                    in_stack_fffffffffffff090);
      }
    }
    else {
      if (local_9d4 == 2) {
        Mat::create(in_stack_fffffffffffff030,_w,_h,(size_t)in_stack_fffffffffffff020,
                    in_stack_fffffffffffff018);
      }
      if (local_9d4 == 3) {
        Mat::create(in_stack_fffffffffffff040,(int)((ulong)in_stack_fffffffffffff038 >> 0x20),
                    (int)in_stack_fffffffffffff038,(int)((ulong)in_stack_fffffffffffff030 >> 0x20),
                    in_stack_fffffffffffff028,in_stack_fffffffffffff020);
      }
      if (local_9d4 == 4) {
        Mat::create(in_stack_fffffffffffff030,(int)(in_stack_fffffffffffff028 >> 0x20),
                    (int)in_stack_fffffffffffff028,(int)((ulong)in_stack_fffffffffffff020 >> 0x20),
                    (int)in_stack_fffffffffffff020,(size_t)in_stack_fffffffffffff018,
                    in_stack_fffffffffffff090);
      }
    }
  }
  else {
    if (local_9d4 == 1) {
      Mat::create(in_stack_fffffffffffff030,_w,(size_t)in_stack_fffffffffffff020,
                  in_stack_fffffffffffff018);
    }
    if (local_9d4 == 2) {
      Mat::create(in_stack_fffffffffffff030,(int)(in_stack_fffffffffffff028 >> 0x20),
                  (int)in_stack_fffffffffffff028,(size_t)in_stack_fffffffffffff020,
                  in_stack_fffffffffffff018);
    }
    if (local_9d4 == 3) {
      Mat::create(in_stack_fffffffffffff040,(int)((ulong)in_stack_fffffffffffff038 >> 0x20),
                  (int)in_stack_fffffffffffff038,(int)((ulong)in_stack_fffffffffffff030 >> 0x20),
                  in_stack_fffffffffffff028,in_stack_fffffffffffff020);
    }
    if (local_9d4 == 4) {
      Mat::create(in_stack_fffffffffffff030,(int)(in_stack_fffffffffffff028 >> 0x20),
                  (int)in_stack_fffffffffffff028,(int)((ulong)in_stack_fffffffffffff020 >> 0x20),
                  (int)in_stack_fffffffffffff020,(size_t)in_stack_fffffffffffff018,
                  in_stack_fffffffffffff090);
    }
  }
  local_880 = local_990;
  bVar2 = true;
  if (*local_990 != 0) {
    local_338 = local_990;
    bVar2 = local_990[8] * (long)(int)local_990[7] == 0;
  }
  if (bVar2) {
    local_974 = -100;
  }
  else {
    for (local_9d8 = 0; local_9d8 < local_9c8; local_9d8 = local_9d8 + 1) {
      for (local_9dc = 0; local_9dc < local_9c4; local_9dc = local_9dc + 1) {
        for (local_9e0 = 0; local_9e0 < local_9c0; local_9e0 = local_9e0 + 1) {
          local_858 = &local_a78;
          local_1ec = *(int *)((long)local_988 + 0x2c);
          local_1f0 = (int)local_988[6];
          local_1f4 = *(undefined4 *)((long)local_988 + 0x34);
          local_200 = *local_988 + local_988[8] * (long)local_9d8 * local_988[2];
          local_208 = local_988[2];
          local_20c = (undefined4)local_988[3];
          local_218 = local_988[4];
          local_1e8 = &local_a78;
          local_1d8 = (long)local_1ec * (long)local_1f0 * local_208;
          local_838 = &local_a30;
          local_840 = &local_a78;
          local_a8 = local_200 + (long)local_1ec * (long)local_1f0 * (long)local_9dc * local_208;
          local_98 = &local_a30;
          local_828 = &local_a30;
          local_9e8 = (void *)(local_a8 + (long)local_1ec * (long)local_9e0 * local_208);
          local_950 = &local_a30;
          local_940 = &local_a78;
          local_790 = &local_b20;
          local_304 = *(int *)((long)local_990 + 0x2c);
          local_308 = (int)local_990[6];
          local_30c = *(undefined4 *)((long)local_990 + 0x34);
          local_318 = *local_990 + local_990[8] * (long)local_9d8 * local_990[2];
          local_320 = local_990[2];
          local_324 = (undefined4)local_990[3];
          local_330 = local_990[4];
          local_300 = &local_b20;
          local_188 = (long)local_304 * (long)local_308 * local_320;
          local_728 = &local_ad8;
          local_730 = &local_b20;
          local_168 = local_318 + (long)local_304 * (long)local_308 * (long)local_9dc * local_320;
          local_158 = &local_ad8;
          local_708 = &local_ad8;
          local_a90 = (void *)(local_168 + (long)local_304 * (long)local_9e0 * local_320);
          local_930 = &local_ad8;
          local_920 = &local_b20;
          local_9f0 = 0;
          local_9f8 = 0;
          local_9fc = 0;
          local_a00 = 0;
          local_a04 = 0;
          local_a08 = 0;
          local_a18 = 0;
          local_a20 = 0;
          local_a28 = 0;
          local_a30 = 0;
          local_a40 = 0;
          local_a44 = 0;
          local_a48 = 0;
          local_a4c = 0;
          local_a60 = 0;
          local_a68 = 0;
          local_a70 = 0;
          local_a78 = 0;
          local_a98 = 0;
          local_aa0 = 0;
          local_aa4 = 0;
          local_aa8 = 0;
          local_aac = 0;
          local_ab0 = 0;
          local_ac0 = 0;
          local_ac8 = 0;
          local_ad0 = 0;
          local_ad8 = 0;
          local_18c = 0x10;
          local_1dc = 0x10;
          local_70c = local_9e0;
          local_734 = local_9dc;
          local_79c = local_9d8;
          local_79d = 1;
          local_82c = local_9e0;
          local_844 = local_9dc;
          local_864 = local_9d8;
          local_865 = 1;
          local_a38 = 0;
          local_a50 = 0;
          local_b20 = 0;
          local_b10 = 0;
          local_b08 = 0;
          local_af8 = 0;
          local_af4 = 0;
          local_af0 = 0;
          local_aec = 0;
          local_ae8 = 0;
          local_ae0 = 0;
          local_b18 = 0;
          local_4d0 = local_920;
          local_4b0 = local_930;
          local_490 = local_940;
          local_470 = local_950;
          local_180 = local_330;
          local_174 = local_324;
          local_170 = local_320;
          local_160 = local_308;
          local_15c = local_304;
          local_c0 = local_218;
          local_b4 = local_20c;
          local_b0 = local_208;
          local_a0 = local_1f0;
          local_9c = local_1ec;
          local_b00 = local_330;
          local_ab8 = local_330;
          local_a58 = local_218;
          local_a10 = local_218;
          for (local_b24 = 0; local_b24 < local_9a0; local_b24 = local_b24 + 1) {
            memcpy(local_a90,local_9e8,(long)local_9bc << 2);
            local_a90 = (void *)((long)local_a90 + (long)local_9bc * 4);
          }
        }
      }
      for (local_b28 = 0; local_b28 < local_9c4; local_b28 = local_b28 + 1) {
        local_7b0 = &local_bc0;
        local_2cc = *(int *)((long)local_990 + 0x2c);
        local_2d0 = (int)local_990[6];
        local_2d4 = *(undefined4 *)((long)local_990 + 0x34);
        local_2e0 = *local_990 + local_990[8] * (long)local_9d8 * local_990[2];
        local_2e8 = local_990[2];
        local_2ec = (undefined4)local_990[3];
        local_2f8 = local_990[4];
        local_2c8 = &local_bc0;
        local_198 = (long)local_2cc * (long)local_2d0 * local_2e8;
        local_740 = &local_b78;
        local_748 = &local_bc0;
        local_b30 = (void *)(local_2e0 +
                            (long)local_2cc * (long)local_2d0 * (long)local_b28 * local_2e8);
        local_128 = &local_b78;
        local_6f0 = &local_b78;
        local_910 = &local_b78;
        local_900 = &local_bc0;
        local_7d0 = &local_c58;
        local_294 = *(int *)((long)local_990 + 0x2c);
        local_298 = (int)local_990[6];
        local_29c = *(undefined4 *)((long)local_990 + 0x34);
        local_2a8 = *local_990 + local_990[8] * (long)local_9d8 * local_990[2];
        local_2b0 = local_990[2];
        local_2b4 = (undefined4)local_990[3];
        local_2c0 = local_990[4];
        local_290 = &local_c58;
        local_1a8 = (long)local_294 * (long)local_298 * local_2b0;
        local_758 = &local_c10;
        local_760 = &local_c58;
        local_108 = local_2a8 + (long)local_294 * (long)local_298 * (long)local_b28 * local_2b0;
        local_f8 = &local_c10;
        local_718 = &local_c10;
        local_bc8 = (void *)(local_108 + (long)local_294 * (long)local_9c0 * local_2b0);
        local_8f0 = &local_c10;
        local_8e0 = &local_c58;
        local_b38 = 0;
        local_b40 = 0;
        local_b44 = 0;
        local_b48 = 0;
        local_b4c = 0;
        local_b50 = 0;
        local_b60 = 0;
        local_b68 = 0;
        local_b70 = 0;
        local_b78 = 0;
        local_b88 = 0;
        local_b8c = 0;
        local_b90 = 0;
        local_b94 = 0;
        local_ba8 = 0;
        local_bb0 = 0;
        local_bb8 = 0;
        local_bc0 = 0;
        local_bd0 = 0;
        local_bd8 = 0;
        local_bdc = 0;
        local_be0 = 0;
        local_be4 = 0;
        local_be8 = 0;
        local_bf8 = 0;
        local_c00 = 0;
        local_c08 = 0;
        local_c10 = 0;
        local_19c = 0x10;
        local_1ac = 0x10;
        local_71c = local_9c0;
        local_74c = local_b28;
        local_764 = local_b28;
        local_7bc = local_9d8;
        local_7bd = 1;
        local_7dc = local_9d8;
        local_7dd = 1;
        local_b80 = 0;
        local_b98 = 0;
        local_c58 = 0;
        local_c48 = 0;
        local_c40 = 0;
        local_c30 = 0;
        local_c2c = 0;
        local_c28 = 0;
        local_c24 = 0;
        local_c20 = 0;
        local_c18 = 0;
        local_c50 = 0;
        local_c5c = local_9bc * local_9a0 * local_9c0;
        local_550 = local_8e0;
        local_530 = local_8f0;
        local_510 = local_900;
        local_4f0 = local_910;
        local_150 = local_2f8;
        local_144 = local_2ec;
        local_140 = local_2e8;
        local_138 = local_b30;
        local_130 = local_2d0;
        local_12c = local_2cc;
        local_120 = local_2c0;
        local_114 = local_2b4;
        local_110 = local_2b0;
        local_100 = local_298;
        local_fc = local_294;
        local_c38 = local_2c0;
        local_bf0 = local_2c0;
        local_ba0 = local_2f8;
        local_b58 = local_2f8;
        for (local_c60 = 1; local_c60 < local_9a4; local_c60 = local_c60 + 1) {
          memcpy(local_bc8,local_b30,(long)local_c5c << 2);
          local_bc8 = (void *)((long)local_bc8 + (long)local_c5c * 4);
        }
      }
      local_7f0 = &local_cb0;
      local_25c = *(int *)((long)local_990 + 0x2c);
      local_260 = (int)local_990[6];
      local_264 = *(undefined4 *)((long)local_990 + 0x34);
      local_c68 = (void *)(*local_990 + local_990[8] * (long)local_9d8 * local_990[2]);
      local_278 = local_990[2];
      local_27c = (undefined4)local_990[3];
      local_288 = local_990[4];
      local_258 = &local_cb0;
      local_1b8 = (long)local_25c * (long)local_260 * local_278;
      local_6f8 = &local_cb0;
      local_8d0 = &local_cb0;
      local_810 = &local_d48;
      local_224 = *(int *)((long)local_990 + 0x2c);
      local_228 = (int)local_990[6];
      local_22c = *(undefined4 *)((long)local_990 + 0x34);
      local_238 = *local_990 + local_990[8] * (long)local_9d8 * local_990[2];
      local_240 = local_990[2];
      local_244 = (undefined4)local_990[3];
      local_250 = local_990[4];
      local_220 = &local_d48;
      local_1c8 = (long)local_224 * (long)local_228 * local_240;
      local_770 = &local_d00;
      local_778 = &local_d48;
      local_cb8 = (void *)(local_238 +
                          (long)local_224 * (long)local_228 * (long)local_9c4 * local_240);
      local_c8 = &local_d00;
      local_6e0 = &local_d00;
      local_8c0 = &local_d00;
      local_8b0 = &local_d48;
      local_c78 = 0;
      local_c7c = 0;
      local_c80 = 0;
      local_c84 = 0;
      local_c98 = 0;
      local_ca0 = 0;
      local_ca8 = 0;
      local_cb0 = 0;
      local_cc0 = 0;
      local_cc8 = 0;
      local_ccc = 0;
      local_cd0 = 0;
      local_cd4 = 0;
      local_cd8 = 0;
      local_ce8 = 0;
      local_cf0 = 0;
      local_cf8 = 0;
      local_d00 = 0;
      local_1bc = 0x10;
      local_1cc = 0x10;
      local_77c = local_9c4;
      local_7fc = local_9d8;
      local_7fd = 1;
      local_81c = local_9d8;
      local_81d = 1;
      local_c70 = 0;
      local_c88 = 0;
      local_d48 = 0;
      local_d38 = 0;
      local_d30 = 0;
      local_d20 = 0;
      local_d1c = 0;
      local_d18 = 0;
      local_d14 = 0;
      local_d10 = 0;
      local_d08 = 0;
      local_d40 = 0;
      local_d4c = local_9bc * local_9a0 * local_9c0 * local_9a4 * local_9c4;
      local_5b0 = local_8b0;
      local_590 = local_8c0;
      local_570 = local_8d0;
      local_270 = local_c68;
      local_f0 = local_250;
      local_e4 = local_244;
      local_e0 = local_240;
      local_d8 = local_cb8;
      local_d0 = local_228;
      local_cc = local_224;
      local_d28 = local_250;
      local_ce0 = local_250;
      local_c90 = local_288;
      for (local_d50 = 1; local_d50 < local_9a8; local_d50 = local_d50 + 1) {
        memcpy(local_cb8,local_c68,(long)local_d4c << 2);
        local_cb8 = (void *)((long)local_cb8 + (long)local_d4c * 4);
      }
    }
    for (local_d54 = 1; local_d54 < local_9ac; local_d54 = local_d54 + 1) {
      local_698 = &local_da8;
      local_64 = *(int *)((long)local_990 + 0x2c);
      local_68 = (int)local_990[6];
      local_6c = *(int *)((long)local_990 + 0x34);
      local_d60 = (void *)*local_990;
      local_80 = local_990[2];
      local_84 = (undefined4)local_990[3];
      local_90 = local_990[4];
      local_60 = &local_da8;
      local_50 = (long)local_64 * (long)local_68 * (long)local_6c * local_80;
      local_700 = &local_da8;
      local_8a0 = &local_da8;
      local_54 = 0x10;
      local_70 = local_9c8;
      local_6a4 = 0;
      local_6a8 = local_9c8;
      local_6a9 = 1;
      local_da8 = 0;
      local_d98 = 0;
      local_d90 = 0;
      local_d80 = 0;
      local_d7c = 0;
      local_d78 = 0;
      local_d74 = 0;
      local_d70 = 0;
      local_d68 = 0;
      local_da0 = 0;
      local_6cc = local_d54 * local_9c8;
      local_6c0 = &local_df8;
      local_1c = *(int *)((long)local_990 + 0x2c);
      local_20 = (int)local_990[6];
      local_24 = *(int *)((long)local_990 + 0x34);
      local_db0 = (void *)(*local_990 + local_990[8] * (long)local_6cc * local_990[2]);
      local_38 = local_990[2];
      local_3c = (undefined4)local_990[3];
      local_48 = local_990[4];
      local_18 = &local_df8;
      local_8 = (long)local_1c * (long)local_20 * (long)local_24 * local_38;
      local_6e8 = &local_df8;
      local_890 = &local_df8;
      local_c = 0x10;
      local_28 = local_9c8;
      local_6d0 = local_9c8;
      local_6d1 = 1;
      local_df8 = 0;
      local_de8 = 0;
      local_de0 = 0;
      local_dd0 = 0;
      local_dcc = 0;
      local_dc8 = 0;
      local_dc4 = 0;
      local_dc0 = 0;
      local_db8 = 0;
      local_df0 = 0;
      local_5f0 = local_890;
      local_5d0 = local_8a0;
      local_78 = local_d60;
      local_30 = local_db0;
      local_dd8 = local_48;
      local_d88 = local_90;
      memcpy(local_db0,local_d60,local_990[8] * (long)local_9c8 * 4);
    }
    local_974 = 0;
  }
  return local_974;
}

Assistant:

int Tile::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int dims = bottom_blob.dims;
    int repeat_w = 1;
    int repeat_h = 1;
    int repeat_d = 1;
    int repeat_c = 1;

    const int repeats_num = repeats.w;

    if (repeats.empty())
    {
        if (dims == 1) // axis == 0
        {
            repeat_w = tiles;
        }
        else if (dims == 2)
        {
            if (axis == 0) repeat_h = tiles;
            if (axis == 1) repeat_w = tiles;
        }
        else if (dims == 3)
        {
            if (axis == 0) repeat_c = tiles;
            if (axis == 1) repeat_h = tiles;
            if (axis == 2) repeat_w = tiles;
        }
        else if (dims == 4)
        {
            if (axis == 0) repeat_c = tiles;
            if (axis == 1) repeat_d = tiles;
            if (axis == 2) repeat_h = tiles;
            if (axis == 3) repeat_w = tiles;
        }
    }
    else
    {
        // numpy style tile
        const int* repeats_ptr = repeats;

        if (repeats_num == 1)
        {
            repeat_w = repeats_ptr[0];
        }
        if (repeats_num == 2)
        {
            repeat_h = repeats_ptr[0];
            repeat_w = repeats_ptr[1];
        }
        if (repeats_num == 3)
        {
            if (dims == 4)
            {
                repeat_d = repeats_ptr[0];
                repeat_h = repeats_ptr[1];
                repeat_w = repeats_ptr[2];
            }
            else
            {
                repeat_c = repeats_ptr[0];
                repeat_h = repeats_ptr[1];
                repeat_w = repeats_ptr[2];
            }
        }
        if (repeats_num == 4)
        {
            repeat_c = repeats_ptr[0];
            repeat_d = repeats_ptr[1];
            repeat_h = repeats_ptr[2];
            repeat_w = repeats_ptr[3];
        }
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    const int outdims = std::max(dims, repeats_num);
    if (repeat_w != 1 && repeat_h == 1 && repeat_d == 1 && repeat_c == 1)
    {
        if (outdims == 1)
            top_blob.create(w * repeat_w, elemsize, opt.blob_allocator);
        if (outdims == 2)
            top_blob.create(w * repeat_w, h, elemsize, opt.blob_allocator);
        if (outdims == 3)
            top_blob.create(w * repeat_w, h, channels, elemsize, opt.blob_allocator);
        if (outdims == 4)
            top_blob.create(w * repeat_w, h, d, channels, elemsize, opt.blob_allocator);
    }
    else if (repeat_h != 1 && repeat_d == 1 && repeat_c == 1)
    {
        if (outdims == 2)
            top_blob.create(w * repeat_w, h * repeat_h, elemsize, opt.blob_allocator);
        if (outdims == 3)
            top_blob.create(w * repeat_w, h * repeat_h, channels, elemsize, opt.blob_allocator);
        if (outdims == 4)
            top_blob.create(w * repeat_w, h * repeat_h, d, channels, elemsize, opt.blob_allocator);
    }
    else if (repeat_d == 1 && repeat_c != 1)
    {
        if (outdims == 3)
            top_blob.create(w * repeat_w, h * repeat_h, channels * repeat_c, elemsize, opt.blob_allocator);
        if (outdims == 4)
            top_blob.create(w * repeat_w, h * repeat_h, d, channels * repeat_c, elemsize, opt.blob_allocator);
    }
    else if (repeat_d != 1 && repeat_c != 1)
    {
        if (outdims == 4)
            top_blob.create(w * repeat_w, h * repeat_h, d * repeat_d, channels * repeat_c, elemsize, opt.blob_allocator);
    }
    else // all ones
    {
        if (repeats_num == 0 || dims == repeats_num)
        {
            top_blob = bottom_blob;
            return 0;
        }

        if (outdims == 2)
            top_blob.create(w * repeat_w, h * repeat_h, elemsize, opt.blob_allocator);
        if (outdims == 3)
            top_blob.create(w * repeat_w, h * repeat_h, channels * repeat_c, elemsize, opt.blob_allocator);
        if (outdims == 4)
            top_blob.create(w * repeat_w, h * repeat_h, d * repeat_d, channels * repeat_c, elemsize, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        // repeat 0-w
        for (int z = 0; z < d; z++)
        {
            for (int y = 0; y < h; y++)
            {
                const float* ptr = bottom_blob.channel(q).depth(z).row(y);
                float* outptr = top_blob.channel(q).depth(z).row(y);

                for (int p = 0; p < repeat_w; p++)
                {
                    memcpy(outptr, ptr, w * sizeof(float));
                    outptr += w;
                }
            }
        }

        // repeat 1-h
        for (int z = 0; z < d; z++)
        {
            const float* ptr = top_blob.channel(q).depth(z);
            float* outptr = top_blob.channel(q).depth(z).row(h);

            const int size = w * repeat_w * h;
            for (int p = 1; p < repeat_h; p++)
            {
                memcpy(outptr, ptr, size * sizeof(float));
                outptr += size;
            }
        }

        // repeat 1-d
        {
            const float* ptr = top_blob.channel(q);
            float* outptr = top_blob.channel(q).depth(d);

            const int size = w * repeat_w * h * repeat_h * d;
            for (int p = 1; p < repeat_d; p++)
            {
                memcpy(outptr, ptr, size * sizeof(float));
                outptr += size;
            }
        }
    }

    // repeat 1-c
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 1; p < repeat_c; p++)
    {
        const float* ptr = top_blob.channel_range(0, channels);
        float* outptr = top_blob.channel_range(p * channels, channels);

        memcpy(outptr, ptr, top_blob.cstep * channels * sizeof(float));
    }

    return 0;
}